

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StringAggDeserialize(Deserializer *deserializer,AggregateFunction *bound_function)

{
  undefined8 *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> sep;
  undefined8 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  undefined8 *local_30;
  undefined8 local_20;
  undefined8 uStack_18;
  
  (**(code **)(*(long *)bound_function + 0x10))(bound_function,100,"separator");
  (**(code **)(*(long *)bound_function + 0xd0))(&local_50,bound_function);
  (**(code **)(*(long *)bound_function + 0x18))(bound_function);
  puVar1 = (undefined8 *)operator_new(0x28);
  if (local_50 == (undefined8 *)&local_40) {
    uStack_18 = uStack_38;
    local_30 = &local_20;
  }
  else {
    local_30 = local_50;
  }
  local_20 = CONCAT71(uStack_3f,local_40);
  *puVar1 = &PTR__StringAggBindData_00897f50;
  puVar1[1] = puVar1 + 3;
  if (local_30 == &local_20) {
    puVar1[3] = local_20;
    puVar1[4] = uStack_18;
  }
  else {
    puVar1[1] = local_30;
    puVar1[3] = local_20;
  }
  puVar1[2] = local_48;
  *(undefined8 **)deserializer = puVar1;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> StringAggDeserialize(Deserializer &deserializer, AggregateFunction &bound_function) {
	auto sep = deserializer.ReadProperty<string>(100, "separator");
	return make_uniq<StringAggBindData>(std::move(sep));
}